

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::receiveIncomingMessage(ConnectionImpl *this)

{
  bool bVar1;
  byte extraout_AL;
  undefined8 *puVar2;
  Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *this_00;
  Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *promise;
  PromiseFulfiller<void> *pPVar3;
  Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_> *value;
  PromiseAwaiter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *this_01;
  PromiseAwaiter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>
  *__return_storage_ptr__;
  ProducerConsumerQueue<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *this_02;
  Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_> *this_03;
  undefined8 in_RSI;
  void *pvVar4;
  undefined4 in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a4;
  undefined1 local_631;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_630;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *f;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_f439;
  Exception local_420;
  Exception *local_290;
  Exception *e;
  Exception *_e428;
  ConnectionImpl *this_local;
  
  this_local = this;
  puVar2 = (undefined8 *)operator_new(0x478);
  *puVar2 = receiveIncomingMessage;
  puVar2[1] = receiveIncomingMessage;
  value = (Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_> *)(puVar2 + 0x85);
  this_01 = (PromiseAwaiter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)
            (puVar2 + 0x87);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)
       (puVar2 + 0x49);
  this_02 = (ProducerConsumerQueue<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>
             *)(puVar2 + 0x8c);
  this_03 = (Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_> *)(puVar2 + 0x89);
  this_00 = (Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)
            (puVar2 + 2);
  puVar2[0x8d] = in_RSI;
  kj::SourceLocation::SourceLocation
            ((SourceLocation *)(puVar2 + 0x82),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
             ,"receiveIncomingMessage",0x1ab,0x39);
  pvVar4 = (void *)puVar2[0x84];
  kj::_::Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::Coroutine
            (this_00,*(SourceLocation *)(puVar2 + 0x82));
  kj::_::Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::
  get_return_object((Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)
                    this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar1 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar2 + 0x475));
  if (bVar1) {
    std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar2 + 0x475));
    local_290 = kj::_::readMaybe<kj::Exception>((Maybe<kj::Exception> *)(puVar2[0x8d] + 0x108));
    e = local_290;
    if (local_290 != (Exception *)0x0) {
      kj::cp<kj::Exception>(&local_420,local_290);
      kj::throwFatalException(&local_420,0);
    }
    if ((*(byte *)(puVar2[0x8d] + 0x2e1) & 1) == 0) {
      kj::ProducerConsumerQueue<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::
      pop(this_02);
      promise = kj::_::Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,decltype(nullptr)>>>::
                await_transform<kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,decltype(nullptr)>>>>
                          ((Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,decltype(nullptr)>>>
                            *)this_00,
                           (Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>
                            *)this_02);
      co_await<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,decltype(nullptr)>>>
                (__return_storage_ptr__,promise);
      bVar1 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
      if (!bVar1) {
        *(undefined1 *)((long)puVar2 + 0x474) = 1;
        _GLOBAL__N_1::TestVat::ConnectionImpl::receiveIncomingMessage
                  ((void *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),pvVar4);
        if ((extraout_AL & 1) != 0) {
          return (PromiseBase)(PromiseBase)this;
        }
      }
      kj::_::PromiseAwaiter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::
      await_resume(this_01);
      kj::_::PromiseAwaiter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::
      ~PromiseAwaiter(__return_storage_ptr__);
      kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::~Promise
                ((Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> *)this_02
                );
      bVar1 = kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>::operator==
                        ((Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_> *)this_01);
      if (bVar1) {
        f = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>
                      ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
                       (puVar2[0x8d] + 0x2d0));
        if (f != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0) {
          local_630 = f;
          pPVar3 = kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(f);
          (*(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar3,&local_631);
        }
      }
      else {
        *(int *)(*(long *)(puVar2[0x8d] + 0x20) + 0x24) =
             *(int *)(*(long *)(puVar2[0x8d] + 0x20) + 0x24) + 1;
      }
      kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>::Maybe
                (this_03,(Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_> *)this_01);
      kj::_::
      CoroutineMixin<kj::_::Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>,_kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>
      ::return_value((CoroutineMixin<kj::_::Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>,_kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>
                      *)this_00,this_03);
      kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>::~Maybe(this_03);
      kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>::~Maybe
                ((Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_> *)this_01);
    }
    else {
      kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>::Maybe(value);
      kj::_::
      CoroutineMixin<kj::_::Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>,_kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>
      ::return_value((CoroutineMixin<kj::_::Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>,_kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>
                      *)this_00,value);
      kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>::~Maybe(value);
    }
    kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
    bVar1 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0x476));
    if (bVar1) {
      std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0x476));
      kj::_::Coroutine<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::~Coroutine
                (this_00);
      if (puVar2 != (undefined8 *)0x0) {
        operator_delete(puVar2,0x478);
      }
    }
    else {
      *puVar2 = 0;
      *(undefined1 *)((long)puVar2 + 0x474) = 2;
      _GLOBAL__N_1::TestVat::ConnectionImpl::receiveIncomingMessage
                ((void *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),pvVar4);
    }
  }
  else {
    *(undefined1 *)((long)puVar2 + 0x474) = 0;
    _GLOBAL__N_1::TestVat::ConnectionImpl::receiveIncomingMessage
              ((void *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),pvVar4);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<kj::Own<IncomingRpcMessage>>> receiveIncomingMessage() override {
      KJ_IF_SOME(e, networkException) {
        kj::throwFatalException(kj::cp(e));
      }

      if (initiatedIdleShutdown) {
        co_return kj::none;
      }

      auto result = co_await messageQueue.pop();

      if (result == kj::none) {
        KJ_IF_SOME(f, fulfillOnEnd) {
          f->fulfill();
        }
      } else {
        ++vat.received;
      }

      co_return result;
    }